

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O3

vector<remote::Region,_std::allocator<remote::Region>_> *
remote::GetRegions(vector<remote::Region,_std::allocator<remote::Region>_> *__return_storage_ptr__,
                  pid_t pid)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  istream *piVar4;
  long lVar5;
  long lVar6;
  string content;
  string str;
  Region r;
  string line;
  stringstream ss;
  stringstream path;
  ifstream m;
  char *local_650;
  long local_648;
  char local_640 [16];
  char *local_630;
  long local_628;
  char local_620 [16];
  vector<remote::Region,_std::allocator<remote::Region>_> *local_610;
  char *local_608;
  long local_600;
  char local_5f8 [16];
  undefined1 local_5e8 [56];
  _Alloc_hider local_5b0;
  size_type local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  _Alloc_hider local_590;
  size_type local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  undefined1 *local_568;
  long local_560;
  undefined1 local_558 [16];
  long *local_548 [2];
  long local_538 [3];
  uint auStack_520 [22];
  ios_base local_4c8 [264];
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [65];
  
  (__return_storage_ptr__->super__Vector_base<remote::Region,_std::allocator<remote::Region>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<remote::Region,_std::allocator<remote::Region>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<remote::Region,_std::allocator<remote::Region>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_610 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_3c0);
  std::__ostream_insert<char,std::char_traits<char>>(local_3b0,"/proc/",6);
  poVar3 = (ostream *)std::ostream::operator<<(local_3b0,pid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/maps",5);
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(local_238,(char *)local_548[0],_S_in);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0]);
  }
  local_568 = local_558;
  local_560 = 0;
  local_558[0] = 0;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_568,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (local_568 != local_558) {
        operator_delete(local_568);
      }
      std::ifstream::~ifstream(local_238);
      std::__cxx11::stringstream::~stringstream(local_3c0);
      std::ios_base::~ios_base(local_340);
      return local_610;
    }
    local_590._M_p = (pointer)&local_580;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_5e8._0_8_ = 0;
    local_5e8._8_8_ = 0;
    local_5e8[0x10] = false;
    local_5e8[0x11] = false;
    local_5e8[0x12] = false;
    local_5e8[0x13] = false;
    local_5e8._40_8_ = 0;
    local_5e8._48_8_ = 0;
    local_5e8._24_8_ = 0;
    local_5e8._32_8_ = 0;
    local_580._M_local_buf[0] = '\0';
    local_588 = 0;
    local_608 = local_5f8;
    local_5b0._M_p = (pointer)&local_5a0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_608,local_568,local_568 + local_560);
    lVar6 = 0;
    while (local_600 != 0) {
      cVar2 = (char)(string *)&local_608;
      lVar5 = std::__cxx11::string::find(cVar2,0x20);
      if (lVar5 == -1) {
        if (local_600 != 0) {
          std::__cxx11::string::_M_assign((string *)&local_5b0);
          if (*local_608 == '/') {
            std::__cxx11::string::rfind(cVar2,0x2f);
            std::__cxx11::string::substr((ulong)local_548,(ulong)&local_608);
            std::__cxx11::string::operator=((string *)&local_590,(string *)local_548);
            if (local_548[0] != local_538) {
              operator_delete(local_548[0]);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_590);
          }
        }
        break;
      }
      std::__cxx11::string::substr((ulong)&local_630,(ulong)&local_608);
      std::__cxx11::stringstream::stringstream((stringstream *)local_548);
      iVar1 = (int)(stringstream *)local_548;
      switch(lVar6) {
      case 0:
        lVar5 = std::__cxx11::string::find((char)&local_630,0x2d);
        if (lVar5 != -1) {
          *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) & 0xffffffb5 | 8;
          std::__cxx11::string::substr((ulong)&local_650,(ulong)&local_630);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_538,local_650,local_648);
          if (local_650 != local_640) {
            operator_delete(local_650);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)local_548);
          std::ios::clear((int)local_548[0][-3] + iVar1);
          *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) & 0xffffffb5 | 8;
          std::__cxx11::string::substr((ulong)&local_650,(ulong)&local_630);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_538,local_650,local_648);
          if (local_650 != local_640) {
            operator_delete(local_650);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)local_548);
          std::ios::clear((int)local_548[0][-3] + iVar1);
        }
        break;
      case 1:
        local_5e8[0x11] = local_630[1] == 'w';
        local_5e8[0x10] = *local_630 == 'r';
        local_5e8[0x12] = local_630[2] == 'x';
        local_5e8[0x13] = local_630[3] == 'p';
        break;
      case 2:
        *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) =
             *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) & 0xffffffb5 | 8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,local_630,local_628)
        ;
        goto LAB_00105fc6;
      case 3:
        lVar5 = std::__cxx11::string::find((char)&local_630,0x3a);
        if (lVar5 != -1) {
          *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) & 0xffffffb5 | 2;
          std::__cxx11::string::substr((ulong)&local_650,(ulong)&local_630);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_538,local_650,local_648);
          if (local_650 != local_640) {
            operator_delete(local_650);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)local_548);
          std::ios::clear((int)local_548[0][-3] + iVar1);
          *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538[0] + -0x18)) & 0xffffffb5 | 2;
          std::__cxx11::string::substr((ulong)&local_650,(ulong)&local_630);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_538,local_650,local_648);
          if (local_650 != local_640) {
            operator_delete(local_650);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)local_548);
          std::ios::clear((int)local_548[0][-3] + iVar1);
        }
        break;
      case 4:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_538,local_630,local_628)
        ;
LAB_00105fc6:
        std::istream::_M_extract<unsigned_long>((ulong *)local_548);
        std::ios::clear((int)local_548[0][-3] + iVar1);
      }
      std::__cxx11::string::substr((ulong)&local_650,(ulong)&local_608);
      std::__cxx11::string::operator=((string *)&local_608,(string *)&local_650);
      if (local_650 != local_640) {
        operator_delete(local_650);
      }
      lVar5 = std::__cxx11::string::find_first_not_of(cVar2,0x20);
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)&local_650,(ulong)&local_608);
        std::__cxx11::string::operator=((string *)&local_608,(string *)&local_650);
        if (local_650 != local_640) {
          operator_delete(local_650);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_548);
      std::ios_base::~ios_base(local_4c8);
      if (local_630 != local_620) {
        operator_delete(local_630);
      }
      lVar6 = lVar6 + 1;
      if (lVar5 == -1) break;
    }
    if ((local_5e8._0_8_ != 0) && (local_5e8._8_8_ != 0)) {
      std::vector<remote::Region,_std::allocator<remote::Region>_>::push_back
                (local_610,(value_type *)local_5e8);
    }
    if (local_608 != local_5f8) {
      operator_delete(local_608);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_p != &local_580) {
      operator_delete(local_590._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_p != &local_5a0) {
      operator_delete(local_5b0._M_p);
    }
  } while( true );
}

Assistant:

vector<Region> remote::GetRegions(pid_t pid) {
    vector<Region> ret;

    stringstream path;
    path << "/proc/" << pid << "/maps";

    ifstream m(path.str().c_str());

    string line;
    while(getline(m, line)) {
        Region r;

        size_t count = 0;

        string str = line;

        while(str.length()) {
            size_t nextSpace = str.find_first_of(' ');

            if(nextSpace == -1) {
                if(!str.empty()) {
                    r.pathname = str;

                    if(str.c_str()[0] == '/') {
                        r.filename = str.substr(str.find_last_of('/') + 1, str.length());
                    } else {
                        r.filename = r.pathname;
                    }
                }

                break; // Stuff
            } else {
                string content = str.substr(0, nextSpace);

                // Deal with content
                stringstream ss;

                if(count == 0) {
                    size_t spl = content.find_first_of('-');

                    if(spl != -1) {
                        ss << hex << content.substr(0, spl);
                        ss >> r.start;
                        ss.clear();
                        ss << hex << content.substr(spl + 1, content.size());
                        ss >> r.end;
                        ss.clear();
                    }
                } else if(count == 1) { // Permissions
                    r.read = (content.c_str()[0] == 'r');
                    r.write = (content.c_str()[1] == 'w');
                    r.exec = (content.c_str()[2] == 'x');
                    r.shared = (content.c_str()[3] == 'p');
                } else if(count == 2) { // Offset
                    ss << hex << content;
                    ss >> r.offset;
                    ss.clear();
                } else if(count == 3) { // Device Info
                    size_t spl = content.find_first_of(':');

                    if(spl != -1) {
                        ss << dec << content.substr(0, spl);
                        ss >> r.deviceMajor;
                        ss.clear();
                        ss << dec << content.substr(spl + 1, content.size());
                        ss >> r.deviceMinor;
                        ss.clear();
                    }
                } else if(count == 4) { // INode shit
                    ss << content;
                    ss >> r.inodeFileNumber;
                    ss.clear();
                }

                count++;

                // Advance
                str = str.substr(nextSpace);

                size_t firstNonSpace = str.find_first_not_of(' ');

                if(firstNonSpace == -1) {
                    break;
                }

                str = str.substr(firstNonSpace);
            }
        }

        if(r.start != 0 && r.end != 0) {
            ret.push_back(r);
        }
    }

    return ret;
}